

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairList.cpp
# Opt level: O1

int * __thiscall OpenMD::PairList::getPairList(PairList *this)

{
  _Rb_tree_header *p_Var1;
  pointer piVar2;
  iterator iVar3;
  int *piVar4;
  int iVar5;
  undefined8 in_RAX;
  _Base_ptr p_Var6;
  int *piVar7;
  undefined8 local_38;
  
  if (this->modified_ == true) {
    piVar2 = (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar2) {
      (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar2;
    }
    p_Var6 = (this->pairSet_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->pairSet_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      local_38 = in_RAX;
      do {
        iVar5 = p_Var6[1]._M_color + _S_black;
        iVar3._M_current =
             (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_38._4_4_ = iVar5;
        if (iVar3._M_current ==
            (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&this->pairList_,iVar3,(int *)((long)&local_38 + 4));
        }
        else {
          *iVar3._M_current = iVar5;
          (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        iVar5 = *(int *)&p_Var6[1].field_0x4 + 1;
        local_38 = CONCAT44(local_38._4_4_,iVar5);
        iVar3._M_current =
             (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&this->pairList_,iVar3,(int *)&local_38);
        }
        else {
          *iVar3._M_current = iVar5;
          (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    }
    this->modified_ = false;
  }
  piVar4 = (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (int *)0x0;
  if (piVar4 != (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    piVar7 = piVar4;
  }
  return piVar7;
}

Assistant:

int* PairList::getPairList() {
    if (modified_) {
      pairList_.clear();

      for (std::set<std::pair<int, int>>::iterator i = pairSet_.begin();
           i != pairSet_.end(); ++i) {
        pairList_.push_back(i->first + 1);
        pairList_.push_back(i->second + 1);
      }
      modified_ = false;
    }

    return pairList_.empty() ? NULL : &(pairList_[0]);
  }